

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_reportModelDense(HModel *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  char buff [16];
  char local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N=",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->numCol);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",  M=",5);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->numRow);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",  NZ= ",7);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (poVar5,(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[this->numCol]);
  local_48[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_48,1);
  if ((this->numCol < 0xb) && (this->numRow < 0x65)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
    uVar10 = (uint)((ulong)((long)(this->colCost).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->colCost).super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar10) {
      uVar13 = 0;
      do {
        sprintf(local_48,"%2.1g ",
                (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar13]);
        sVar6 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar6);
        uVar13 = uVar13 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar13);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------A------\n",0xe);
    if (0 < this->numRow) {
      iVar11 = 0;
      do {
        if (0 < this->numCol) {
          lVar14 = 0;
          do {
            piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar3 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar9 = piVar2[lVar14];
            lVar7 = (long)iVar9;
            bVar15 = piVar3[lVar7] == iVar11;
            if (bVar15) {
LAB_0013153f:
              if (piVar2[lVar14 + 1] <= iVar9) goto LAB_00131586;
              sprintf(local_48,"%2.1g ",
                      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7]);
              *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
              sVar6 = strlen(local_48);
              pcVar12 = local_48;
            }
            else {
              iVar1 = piVar2[lVar14 + 1];
              iVar4 = iVar1;
              if (iVar1 < iVar9) {
                iVar4 = iVar9;
              }
              if (iVar9 < iVar1) {
                lVar8 = lVar7;
                do {
                  iVar9 = iVar9 + 1;
                  lVar7 = lVar8 + 1;
                  bVar15 = piVar3[lVar8 + 1] == iVar11;
                  if (bVar15) goto LAB_0013153f;
                  lVar8 = lVar7;
                } while (iVar4 != lVar7);
              }
              iVar9 = (int)lVar7;
              if (bVar15) goto LAB_0013153f;
LAB_00131586:
              *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
              sVar6 = 1;
              pcVar12 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar6);
            lVar14 = lVar14 + 1;
          } while (lVar14 < this->numCol);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->numRow);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------LB------\n",0xf)
    ;
    if (0 < this->numRow) {
      lVar14 = 0;
      do {
        if ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] <= -1e+200) {
          builtin_strncpy(local_48,"-inf",5);
        }
        else {
          sprintf(local_48,"%2.1g ");
        }
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        sVar6 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar6);
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->numRow);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------UB------\n",0xf)
    ;
    if (0 < this->numRow) {
      lVar14 = 0;
      do {
        if (1e+200 <= (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar14]) {
          builtin_strncpy(local_48,"inf",4);
        }
        else {
          sprintf(local_48,"%2.1g ");
        }
        *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
        sVar6 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar6);
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->numRow);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
  }
  return;
}

Assistant:

void HModel::util_reportModelDense() {
  cout<<"N="<<numCol<<",  M="<<numRow<<",  NZ= "<<Astart[numCol]<<'\n';	
  if (numCol>10 || numRow>100) return;
  cout<<"\n-----cost-----\n";
  
  char buff [16];
  int colCostSz = colCost.size();
  for (int i=0; i<colCostSz; i++) { 
    sprintf(buff, "%2.1g ", colCost[i]);
    cout<<buff; 
  }
  cout<<endl;
  cout<<"------A------\n";
  for (int i=0;i<numRow;i++) {
    for (int j=0;j<numCol;j++) {
      
      int ind = Astart[j];
      while (Aindex[ind]!=i && ind<Astart[j+1]) 
	ind++;
      
      
      //if a_ij is nonzero print
      if (Aindex[ind]==i && ind<Astart[j+1])
	{	
	  sprintf(buff, "%2.1g ", Avalue[ind]);
	  cout<<setw(5)<<buff;
	}
      else cout<<setw(5)<<" ";
      
    }
    cout<<endl;
  }
  cout<<"------LB------\n";
  for (int i=0;i<numRow;i++) { 	
    if (rowLower[i]>-HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowLower[i]);
    else 
      sprintf(buff, "-inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
  cout<<"------UB------\n";
  for (int i=0;i<numRow;i++) { 
    if (rowUpper[i]<HSOL_CONST_INF)
      sprintf(buff, "%2.1g ", rowUpper[i]);
    else 
      sprintf(buff, "inf");
    cout<<setw(5)<<buff; 
  }
  cout<<endl;
}